

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_readStats_wksp(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                         U32 *tableLogPtr,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                         int flags)

{
  size_t in_RCX;
  BYTE *in_RDX;
  U32 *in_R8;
  U32 *in_R9;
  void *in_stack_00000018;
  size_t in_stack_00000080;
  void *in_stack_00000088;
  size_t in_stack_00000090;
  U32 *in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  if (((ulong)src & 1) == 0) {
    local_8 = HUF_readStats_body_default
                        (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_00000018,
                         in_stack_00000080,in_stack_00000088,in_stack_00000090);
  }
  else {
    local_8 = HUF_readStats_body_bmi2
                        (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_00000018,
                         in_stack_00000080,in_stack_00000088,in_stack_00000090);
  }
  return local_8;
}

Assistant:

size_t HUF_readStats_wksp(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize,
                     int flags)
{
#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        return HUF_readStats_body_bmi2(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
    }
#endif
    (void)flags;
    return HUF_readStats_body_default(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
}